

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *pXVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  xml_output local_a40;
  xml_output local_a08;
  xml_output local_9d0;
  xml_output local_998;
  QArrayDataPointer<char16_t> local_960;
  QArrayDataPointer<char16_t> local_948;
  xml_output local_930;
  QArrayDataPointer<char16_t> local_8f8;
  xml_output local_8e0;
  QArrayDataPointer<char16_t> local_8a8;
  xml_output local_890;
  xml_output local_858;
  xml_output local_820;
  QArrayDataPointer<char16_t> local_7e8;
  QArrayDataPointer<char16_t> local_7d0;
  xml_output local_7b8;
  QArrayDataPointer<char16_t> local_780;
  QArrayDataPointer<char16_t> local_768;
  xml_output local_750;
  QArrayDataPointer<char16_t> local_718;
  xml_output local_700;
  QArrayDataPointer<char16_t> local_6c8;
  xml_output local_6b0;
  QArrayDataPointer<char16_t> local_678;
  xml_output local_660;
  QArrayDataPointer<char16_t> local_628;
  xml_output local_610;
  QArrayDataPointer<char16_t> local_5d8;
  QArrayDataPointer<char16_t> local_5c0;
  xml_output local_5a8;
  QArrayDataPointer<char16_t> local_570;
  QArrayDataPointer<char16_t> local_558;
  xml_output local_540;
  QArrayDataPointer<char16_t> local_508;
  QArrayDataPointer<char16_t> local_4f0;
  QStringBuilder<QString,_QString_&> local_4d8;
  QArrayDataPointer<char16_t> local_4b8;
  QArrayDataPointer<char16_t> local_4a0;
  xml_output local_488;
  QArrayDataPointer<char16_t> local_450;
  xml_output local_438;
  xml_output local_400;
  xml_output local_3c8;
  QArrayDataPointer<char16_t> local_390;
  xml_output local_378;
  QArrayDataPointer<char16_t> local_340;
  xml_output local_328;
  xml_output local_2f0;
  QArrayDataPointer<char16_t> local_2b8;
  xml_output local_2a0;
  QArrayDataPointer<char16_t> local_268;
  xml_output local_250;
  QArrayDataPointer<char16_t> local_218;
  xml_output local_200;
  QArrayDataPointer<char16_t> local_1c8;
  QArrayDataPointer<char16_t> local_1b0;
  xml_output local_198;
  QArrayDataPointer<char16_t> local_160;
  QArrayDataPointer<char16_t> local_148;
  xml_output local_130;
  QArrayDataPointer<char16_t> local_f8;
  xml_output local_e0;
  QArrayDataPointer<char16_t> local_a8;
  xml_output local_90;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_130.xo_type = tNothing;
  local_130._4_4_ = 0;
  local_130.xo_text.d.d = (Data *)0x0;
  local_130.xo_text.d.ptr = (char16_t *)0x0;
  local_58.size = -0x5555555555555556;
  local_90.xo_text.d.size = *(long *)((long)__buf + 0x40) + 0x60;
  local_90.xo_type = tNothing;
  local_90._4_4_ = 0;
  local_e0.xo_type = tNothing;
  local_e0._4_4_ = 0;
  local_e0.xo_text.d.d = (Data *)0x0;
  local_e0.xo_text.d.ptr = (char16_t *)0x0;
  local_90.xo_text.d.d = (Data *)0x21f854;
  local_90.xo_text.d.ptr = (char16_t *)0xc;
  QStringBuilder<QString,_QString_&>::convertTo<QString>
            ((QString *)&local_58,(QStringBuilder<QString,_QString_&> *)&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_130);
  QString::QString((QString *)&local_a8,"Target");
  tag(&local_90,(QString *)&local_a8);
  pXVar1 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_90);
  QString::QString((QString *)&local_f8,"Name");
  attributeTag(&local_e0,(QString *)&local_f8,(QString *)&local_58);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_e0);
  QString::QString((QString *)&local_148,"Condition");
  generateCondition((QString *)&local_160,*(VCConfiguration **)((long)__buf + 0x40));
  attributeTag(&local_130,(QString *)&local_148,(QString *)&local_160);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_130);
  QString::QString((QString *)&local_1b0,"Inputs");
  QString::QString((QString *)&local_1c8,"$(OutDir)\\$(TargetName).exe");
  attributeTag(&local_198,(QString *)&local_1b0,(QString *)&local_1c8);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_198);
  QString::QString((QString *)&local_218,"Outputs");
  attributeTag(&local_200,(QString *)&local_218,(QString *)((long)__buf + 8));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_200);
  QString::QString((QString *)&local_268,"Message");
  tag(&local_250,(QString *)&local_268);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_250);
  QString::QString((QString *)&local_2b8,"Text");
  attributeTag(&local_2a0,(QString *)&local_2b8,(QString *)((long)__buf + 0x20));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_2a0);
  closetag();
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_2f0);
  QString::QString((QString *)&local_340,"Exec");
  tag(&local_328,(QString *)&local_340);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_328);
  QString::QString((QString *)&local_390,"Command");
  attributeTag(&local_378,(QString *)&local_390,(QString *)((long)__buf + 0x20));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_378);
  closetag();
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_3c8);
  closetag();
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_400);
  QString::QString((QString *)&local_450,"Target");
  tag(&local_438,(QString *)&local_450);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_438);
  QString::QString((QString *)&local_4a0,"Name");
  local_508.d = (Data *)0x0;
  local_508.ptr = (char16_t *)0x0;
  local_508.size = 0;
  local_4d8.b = (QString *)(*(long *)((long)__buf + 0x40) + 0x60);
  local_4d8.a.d.d = (Data *)0x0;
  local_4f0.d = (Data *)0x0;
  local_4f0.ptr = (char16_t *)0x0;
  local_4f0.size = 0;
  local_4d8.a.d.ptr = L"PopulateWinDeployQtItems_";
  local_4d8.a.d.size = 0x19;
  QStringBuilder<QString,_QString_&>::convertTo<QString>((QString *)&local_4b8,&local_4d8);
  attributeTag(&local_488,(QString *)&local_4a0,(QString *)&local_4b8);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_488);
  QString::QString((QString *)&local_558,"Condition");
  generateCondition((QString *)&local_570,*(VCConfiguration **)((long)__buf + 0x40));
  attributeTag(&local_540,(QString *)&local_558,(QString *)&local_570);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_540);
  QString::QString((QString *)&local_5c0,"AfterTargets");
  QString::QString((QString *)&local_5d8,"Link");
  attributeTag(&local_5a8,(QString *)&local_5c0,(QString *)&local_5d8);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_5a8);
  QString::QString((QString *)&local_628,"DependsOnTargets");
  attributeTag(&local_610,(QString *)&local_628,(QString *)&local_58);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_610);
  QString::QString((QString *)&local_678,"ReadLinesFromFile");
  tag(&local_660,(QString *)&local_678);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_660);
  QString::QString((QString *)&local_6c8,"File");
  attributeTag(&local_6b0,(QString *)&local_6c8,(QString *)((long)__buf + 8));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_6b0);
  QString::QString((QString *)&local_718,"Output");
  tag(&local_700,(QString *)&local_718);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_700);
  QString::QString((QString *)&local_768,"TaskParameter");
  QString::QString((QString *)&local_780,"Lines");
  attributeTag(&local_750,(QString *)&local_768,(QString *)&local_780);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_750);
  QString::QString((QString *)&local_7d0,"ItemName");
  QString::QString((QString *)&local_7e8,"DeploymentItems");
  attributeTag(&local_7b8,(QString *)&local_7d0,(QString *)&local_7e8);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_7b8);
  closetag();
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_820);
  closetag();
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_858);
  QString::QString((QString *)&local_8a8,"ItemGroup");
  tag(&local_890,(QString *)&local_8a8);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_890);
  QString::QString((QString *)&local_8f8,"None");
  tag(&local_8e0,(QString *)&local_8f8);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_8e0);
  QString::QString((QString *)&local_948,"Include");
  QString::QString((QString *)&local_960,"@(DeploymentItems)");
  attributeTag(&local_930,(QString *)&local_948,(QString *)&local_960);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_930);
  attrTagT(&local_998,"DeploymentContent",_True);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_998);
  closetag();
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_9d0);
  closetag();
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_a08);
  closetag();
  XmlOutput::operator<<(pXVar1,&local_a40);
  XmlOutput::xml_output::~xml_output(&local_a40);
  XmlOutput::xml_output::~xml_output(&local_a08);
  XmlOutput::xml_output::~xml_output(&local_9d0);
  XmlOutput::xml_output::~xml_output(&local_998);
  XmlOutput::xml_output::~xml_output(&local_930);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_960);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_948);
  XmlOutput::xml_output::~xml_output(&local_8e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_8f8);
  XmlOutput::xml_output::~xml_output(&local_890);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_8a8);
  XmlOutput::xml_output::~xml_output(&local_858);
  XmlOutput::xml_output::~xml_output(&local_820);
  XmlOutput::xml_output::~xml_output(&local_7b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_7e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_7d0);
  XmlOutput::xml_output::~xml_output(&local_750);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_780);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_768);
  XmlOutput::xml_output::~xml_output(&local_700);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_718);
  XmlOutput::xml_output::~xml_output(&local_6b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_6c8);
  XmlOutput::xml_output::~xml_output(&local_660);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_678);
  XmlOutput::xml_output::~xml_output(&local_610);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_628);
  XmlOutput::xml_output::~xml_output(&local_5a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_5d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_5c0);
  XmlOutput::xml_output::~xml_output(&local_540);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_570);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_558);
  XmlOutput::xml_output::~xml_output(&local_488);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_508);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4a0);
  XmlOutput::xml_output::~xml_output(&local_438);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_450);
  XmlOutput::xml_output::~xml_output(&local_400);
  XmlOutput::xml_output::~xml_output(&local_3c8);
  XmlOutput::xml_output::~xml_output(&local_378);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_390);
  XmlOutput::xml_output::~xml_output(&local_328);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_340);
  XmlOutput::xml_output::~xml_output(&local_2f0);
  XmlOutput::xml_output::~xml_output(&local_2a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
  XmlOutput::xml_output::~xml_output(&local_250);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_268);
  XmlOutput::xml_output::~xml_output(&local_200);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_218);
  XmlOutput::xml_output::~xml_output(&local_198);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
  XmlOutput::xml_output::~xml_output(&local_130);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  XmlOutput::xml_output::~xml_output(&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  XmlOutput::xml_output::~xml_output(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCWinDeployQtTool &tool)
{
    const QString name = QStringLiteral("WinDeployQt_") + tool.config->Name;
    xml << tag("Target")
           << attrTag(_Name, name)
           << attrTag("Condition", generateCondition(*tool.config))
           << attrTag("Inputs", "$(OutDir)\\$(TargetName).exe")
           << attrTag("Outputs", tool.Record)
           << tag(_Message)
              << attrTag("Text", tool.CommandLine)
           << closetag()
           << tag("Exec")
             << attrTag("Command", tool.CommandLine)
           << closetag()
        << closetag()
        << tag("Target")
           << attrTag(_Name, QStringLiteral("PopulateWinDeployQtItems_") + tool.config->Name)
           << attrTag("Condition", generateCondition(*tool.config))
           << attrTag("AfterTargets", "Link")
           << attrTag("DependsOnTargets", name)
           << tag("ReadLinesFromFile")
              << attrTag("File", tool.Record)
              << tag("Output")
                 << attrTag("TaskParameter", "Lines")
                 << attrTag("ItemName", "DeploymentItems")
              << closetag()
           << closetag()
           << tag(_ItemGroup)
              << tag("None")
                 << attrTag("Include", "@(DeploymentItems)")
                 << attrTagT("DeploymentContent", _True)
              << closetag()
           << closetag()
        << closetag();
}